

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_length_static_Test::TestBody(Test_aistr_length_static_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  size_t local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8 [2];
  out_of_range *anon_var_0;
  char *pcStack_d0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_c0;
  int local_b4;
  size_t local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  int local_84;
  size_t local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58 [3];
  int local_3c;
  size_t local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  char buf [10];
  Test_aistr_length_static_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = ai::length<10ul>((char (*) [10])&gtest_ar.message_);
  local_3c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_30,"ai::length(buf)","0",&local_38,&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
    return;
  }
  strcpy((char *)&gtest_ar.message_,"1234");
  local_80 = ai::length<10ul>((char (*) [10])&gtest_ar.message_);
  local_84 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_78,"ai::length(buf)","4",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
    return;
  }
  strcpy((char *)&gtest_ar.message_,"123456789");
  local_b0 = ai::length<10ul>((char (*) [10])&gtest_ar.message_);
  local_b4 = 9;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_a8,"ai::length(buf)","9",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_c0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
    return;
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff30);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::length<10ul>((char (*) [10])&gtest_ar.message_);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00118390;
    pcStack_d0 = 
    "Expected: ai::length(buf) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x3c,pcStack_d0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
  testing::Message::~Message(local_e8);
LAB_00118390:
  local_108 = ai::length<10ul>((char (*) [10])&gtest_ar.message_);
  local_10c = 9;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_100,"ai::length(buf)","9",&local_108,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  return;
}

Assistant:

TEST_F(Test_aistr, length_static) {
    char buf[10] = {0};
    ASSERT_EQ(ai::length(buf), 0);

#ifdef _MSC_VER
    strcpy_s(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy_s(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#else
    strcpy(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#endif

    // make buffer without last null-terminated char
    buf[9] = '0';
    EXPECT_THROW(ai::length(buf), std::out_of_range);

    buf[9] = '\0';
    ASSERT_EQ(ai::length(buf), 9);
}